

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_marker(stbi__jpeg *z,int m)

{
  stbi__context *psVar1;
  byte *pbVar2;
  stbi_uc *psVar3;
  byte bVar4;
  stbi_uc sVar5;
  byte bVar6;
  sbyte sVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  stbi_uc *psVar11;
  ulong uVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  byte bVar17;
  bool bVar18;
  int sizes [16];
  uint local_78 [18];
  
  if (m < 0xdd) {
    if (m == 0xc4) {
      uVar8 = stbi__get16be(z->s);
      iVar9 = uVar8 - 2;
      if (2 < uVar8) {
        do {
          psVar1 = z->s;
          pbVar2 = psVar1->img_buffer;
          if (pbVar2 < psVar1->img_buffer_end) {
            psVar1->img_buffer = pbVar2 + 1;
            bVar4 = *pbVar2;
          }
          else if (psVar1->read_from_callbacks == 0) {
            bVar4 = 0;
          }
          else {
            psVar3 = psVar1->buffer_start;
            iVar10 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
            if (iVar10 == 0) {
              psVar1->read_from_callbacks = 0;
              psVar11 = psVar1->buffer_start + 1;
              psVar1->buffer_start[0] = '\0';
              bVar4 = 0;
            }
            else {
              psVar11 = psVar3 + iVar10;
              bVar4 = *psVar3;
            }
            psVar1->img_buffer_end = psVar11;
            psVar1->img_buffer = psVar1->buffer_start + 1;
          }
          if ((0x1f < bVar4) || (bVar17 = bVar4 & 0xf, 3 < bVar17)) {
            stbi__g_failure_reason = "bad DHT header";
            goto LAB_00166a1f;
          }
          lVar16 = 0;
          uVar8 = 0;
          do {
            psVar1 = z->s;
            pbVar2 = psVar1->img_buffer;
            if (pbVar2 < psVar1->img_buffer_end) {
              psVar1->img_buffer = pbVar2 + 1;
              bVar6 = *pbVar2;
            }
            else if (psVar1->read_from_callbacks == 0) {
              bVar6 = 0;
            }
            else {
              psVar3 = psVar1->buffer_start;
              iVar10 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
              if (iVar10 == 0) {
                psVar1->read_from_callbacks = 0;
                psVar11 = psVar1->buffer_start + 1;
                psVar1->buffer_start[0] = '\0';
                bVar6 = 0;
              }
              else {
                psVar11 = psVar3 + iVar10;
                bVar6 = *psVar3;
              }
              psVar1->img_buffer_end = psVar11;
              psVar1->img_buffer = psVar1->buffer_start + 1;
            }
            local_78[lVar16] = (uint)bVar6;
            uVar8 = uVar8 + bVar6;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x10);
          if (bVar4 < 0x10) {
            iVar10 = stbi__build_huffman(z->huff_dc + bVar17,(int *)local_78);
            lVar16 = 8;
          }
          else {
            iVar10 = stbi__build_huffman(z->huff_ac + bVar17,(int *)local_78);
            lVar16 = 0x1a48;
          }
          if (iVar10 == 0) goto LAB_00166a1f;
          if (uVar8 != 0) {
            uVar12 = 0;
            do {
              psVar1 = z->s;
              psVar3 = psVar1->img_buffer;
              if (psVar3 < psVar1->img_buffer_end) {
                psVar1->img_buffer = psVar3 + 1;
                sVar5 = *psVar3;
              }
              else if (psVar1->read_from_callbacks == 0) {
                sVar5 = '\0';
              }
              else {
                psVar3 = psVar1->buffer_start;
                iVar10 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
                if (iVar10 == 0) {
                  psVar1->read_from_callbacks = 0;
                  psVar11 = psVar1->buffer_start + 1;
                  psVar1->buffer_start[0] = '\0';
                  sVar5 = '\0';
                }
                else {
                  psVar11 = psVar3 + iVar10;
                  sVar5 = *psVar3;
                }
                psVar1->img_buffer_end = psVar11;
                psVar1->img_buffer = psVar1->buffer_start + 1;
              }
              z->huff_dc[bVar17].values[uVar12 + lVar16 + -8] = sVar5;
              uVar12 = uVar12 + 1;
            } while (uVar8 != uVar12);
          }
          if (0xf < bVar4) {
            lVar16 = 0;
            do {
              uVar12 = (ulong)z->huff_ac[bVar17].fast[lVar16];
              z->fast_ac[bVar17][lVar16] = 0;
              if (uVar12 != 0xff) {
                bVar4 = z->huff_ac[bVar17].values[uVar12];
                if ((bVar4 & 0xf) != 0) {
                  bVar6 = z->huff_ac[bVar17].size[uVar12];
                  uVar13 = (bVar4 & 0xf) + (ushort)bVar6;
                  if (uVar13 < 10) {
                    uVar15 = (int)lVar16 << (bVar6 & 0x1f) & 0x1ff;
                    sVar7 = (sbyte)(bVar4 & 0xf);
                    uVar14 = -1 << sVar7 | 1;
                    if (0xff < uVar15) {
                      uVar14 = 0;
                    }
                    iVar10 = uVar14 + (uVar15 >> (9U - sVar7 & 0x1f));
                    if ((char)iVar10 == iVar10) {
                      z->fast_ac[bVar17][lVar16] = (short)iVar10 * 0x100 | bVar4 & 0xfff0 | uVar13;
                    }
                  }
                }
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != 0x200);
          }
          iVar9 = (iVar9 + -0x11) - uVar8;
        } while (0 < iVar9);
      }
    }
    else {
      if (m != 0xdb) {
LAB_00166665:
        if (m == 0xfe || (m & 0xfffffff0U) == 0xe0) {
          psVar1 = z->s;
          iVar9 = stbi__get16be(psVar1);
          stbi__skip(psVar1,iVar9 + -2);
          goto LAB_001669e8;
        }
        goto LAB_00166a1f;
      }
      uVar8 = stbi__get16be(z->s);
      iVar9 = uVar8 - 2;
      iVar10 = iVar9;
      if (2 < uVar8) {
        do {
          psVar1 = z->s;
          pbVar2 = psVar1->img_buffer;
          if (pbVar2 < psVar1->img_buffer_end) {
            psVar1->img_buffer = pbVar2 + 1;
            bVar4 = *pbVar2;
LAB_00166580:
            if (0xf < bVar4) {
              stbi__g_failure_reason = "bad DQT type";
              goto LAB_00166a1f;
            }
            if (3 < bVar4) {
              stbi__g_failure_reason = "bad DQT table";
              goto LAB_00166a1f;
            }
          }
          else {
            if (psVar1->read_from_callbacks != 0) {
              psVar3 = psVar1->buffer_start;
              iVar9 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
              if (iVar9 == 0) {
                psVar1->read_from_callbacks = 0;
                psVar11 = psVar1->buffer_start + 1;
                psVar1->buffer_start[0] = '\0';
                bVar4 = 0;
              }
              else {
                psVar11 = psVar3 + iVar9;
                bVar4 = *psVar3;
              }
              psVar1->img_buffer_end = psVar11;
              psVar1->img_buffer = psVar1->buffer_start + 1;
              goto LAB_00166580;
            }
            bVar4 = 0;
          }
          lVar16 = 0;
          do {
            psVar1 = z->s;
            psVar3 = psVar1->img_buffer;
            if (psVar3 < psVar1->img_buffer_end) {
              psVar1->img_buffer = psVar3 + 1;
              sVar5 = *psVar3;
            }
            else if (psVar1->read_from_callbacks == 0) {
              sVar5 = '\0';
            }
            else {
              psVar3 = psVar1->buffer_start;
              iVar9 = (*(psVar1->io).read)(psVar1->io_user_data,(char *)psVar3,psVar1->buflen);
              if (iVar9 == 0) {
                psVar1->read_from_callbacks = 0;
                psVar11 = psVar1->buffer_start + 1;
                psVar1->buffer_start[0] = '\0';
                sVar5 = '\0';
              }
              else {
                psVar11 = psVar3 + iVar9;
                sVar5 = *psVar3;
              }
              psVar1->img_buffer_end = psVar11;
              psVar1->img_buffer = psVar1->buffer_start + 1;
            }
            z->dequant[bVar4][""[lVar16]] = sVar5;
            lVar16 = lVar16 + 1;
          } while (lVar16 != 0x40);
          iVar9 = iVar10 + -0x41;
          bVar18 = 0x41 < iVar10;
          iVar10 = iVar9;
        } while (bVar18);
      }
    }
    bVar18 = iVar9 == 0;
  }
  else {
    if (m == 0xdd) {
      iVar9 = stbi__get16be(z->s);
      if (iVar9 == 4) {
        iVar9 = stbi__get16be(z->s);
        z->restart_interval = iVar9;
LAB_001669e8:
        bVar18 = true;
        goto LAB_00166a21;
      }
      stbi__g_failure_reason = "bad DRI len";
    }
    else {
      if (m != 0xff) goto LAB_00166665;
      stbi__g_failure_reason = "expected marker";
    }
LAB_00166a1f:
    bVar18 = false;
  }
LAB_00166a21:
  return (int)bVar18;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4;
            int t = q & 15,i;
            if (p != 0) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");
            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = stbi__get8(z->s);
            L -= 65;
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }
   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      stbi__skip(z->s, stbi__get16be(z->s)-2);
      return 1;
   }
   return 0;
}